

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O2

uint __thiscall
xercesc_4_0::NamespaceScope::getNamespaceForPrefix(NamespaceScope *this,XMLCh *prefixToMap)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint *puVar5;
  uint *puVar6;
  bool bVar7;
  
  uVar2 = XMLStringPool::getId(&this->fPrefixPool,prefixToMap);
  if (uVar2 != 0) {
    uVar3 = (ulong)this->fStackTop;
    while ((int)uVar3 != 0) {
      uVar3 = (ulong)((int)uVar3 - 1);
      uVar4 = (ulong)this->fStack[uVar3]->fMapCount;
      if (uVar4 != 0) {
        puVar5 = &this->fStack[uVar3]->fMap[-1].fURIId;
        while (bVar7 = uVar4 != 0, uVar4 = uVar4 - 1, bVar7) {
          puVar6 = puVar5 + 2;
          puVar1 = puVar5 + 1;
          puVar5 = puVar6;
          if (*puVar1 == uVar2) goto LAB_00307898;
        }
      }
    }
  }
  puVar6 = &this->fEmptyNamespaceId;
LAB_00307898:
  return *puVar6;
}

Assistant:

unsigned int
NamespaceScope::getNamespaceForPrefix(const XMLCh* const prefixToMap) const {

    //
    //  Map the prefix to its unique id, from the prefix string pool. If its
    //  not a valid prefix, then its a failure.
    //
    unsigned int prefixId = fPrefixPool.getId(prefixToMap);

    if (!prefixId){
        return fEmptyNamespaceId;
    }

    //
    //  Start at the stack top and work backwards until we come to some
    //  element that mapped this prefix.
    //
    for (unsigned int index = fStackTop; index > 0; index--)
    {
        // Get a convenience pointer to the current element
        StackElem* curRow = fStack[index-1];

        // If no prefixes mapped at this level, then go the next one
        if (!curRow->fMapCount)
            continue;

        // Search the map at this level for the passed prefix
        for (unsigned int mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
        {
            if (curRow->fMap[mapIndex].fPrefId == prefixId)
                return curRow->fMap[mapIndex].fURIId;
        }
    }

    return fEmptyNamespaceId;
}